

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O0

void __thiscall Triangle::prepare_coords(Triangle *this)

{
  float *pfVar1;
  Vector3f *in_RDI;
  float fVar2;
  float fVar3;
  double dVar4;
  float C;
  Vector3f norm;
  Vector3f v2;
  Vector3f v1;
  Matrix3f *in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  float fVar5;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Vector3f *in_stack_ffffffffffffff60;
  Vector3f *in_stack_ffffffffffffff68;
  Vector3f *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff9c;
  bool *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Vector3f local_2c;
  Vector3f local_20;
  Vector3f local_14;
  
  if (((uint)in_RDI[2].m_elements[0] & 0x10000) != 0) {
    return;
  }
  Vector3f::Vector3f(&local_14,0.0);
  Vector3f::Vector3f(&local_20,0.0);
  Vector3f::operator=((Vector3f *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (Vector3f *)in_stack_ffffffffffffff28);
  ::operator-(in_RDI,(Vector3f *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ::operator-(in_RDI,(Vector3f *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  Vector3f::cross(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Vector3f::normalized((Vector3f *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  fVar2 = Vector3f::dot((Vector3f *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (Vector3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  pfVar1 = Vector3f::operator[](&local_2c,0);
  dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
  fVar3 = SUB84(dVar4,0);
  pfVar1 = Vector3f::operator[](&local_2c,1);
  dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
  fVar5 = in_stack_ffffffffffffff38;
  if (SUB84(dVar4,0) < fVar3) {
    pfVar1 = Vector3f::operator[](&local_2c,0);
    dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
    in_stack_ffffffffffffff50 = SUB84(dVar4,0);
    pfVar1 = Vector3f::operator[](&local_2c,2);
    dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
    fVar5 = in_stack_ffffffffffffff38;
    if (SUB84(dVar4,0) < in_stack_ffffffffffffff50) {
      fVar5 = fVar2;
      pfVar1 = Vector3f::operator[](&local_2c,0);
      in_stack_ffffffffffffff4c = fVar2 / *pfVar1;
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[10].m_elements + 2),0);
      *pfVar1 = in_stack_ffffffffffffff4c;
      goto LAB_0035fd39;
    }
  }
  in_stack_ffffffffffffff38 = fVar2;
  fVar2 = in_stack_ffffffffffffff48;
  pfVar1 = Vector3f::operator[](&local_2c,1);
  dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
  in_stack_ffffffffffffff44 = SUB84(dVar4,0);
  pfVar1 = Vector3f::operator[](&local_2c,0);
  dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
  if (SUB84(dVar4,0) < in_stack_ffffffffffffff44) {
    pfVar1 = Vector3f::operator[](&local_2c,1);
    dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
    in_stack_ffffffffffffff40 = SUB84(dVar4,0);
    pfVar1 = Vector3f::operator[](&local_2c,2);
    dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
    if (SUB84(dVar4,0) < in_stack_ffffffffffffff40) {
      fVar5 = in_stack_ffffffffffffff38;
      pfVar1 = Vector3f::operator[](&local_2c,1);
      in_stack_ffffffffffffff3c = in_stack_ffffffffffffff38 / *pfVar1;
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[10].m_elements + 2),1);
      *pfVar1 = in_stack_ffffffffffffff3c;
      goto LAB_0035fd39;
    }
  }
  in_stack_ffffffffffffff30 = in_stack_ffffffffffffff38;
  in_stack_ffffffffffffff38 = fVar5;
  fVar5 = in_stack_ffffffffffffff30;
  pfVar1 = Vector3f::operator[](&local_2c,2);
  in_stack_ffffffffffffff34 = in_stack_ffffffffffffff30 / *pfVar1;
  pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[10].m_elements + 2),2);
  *pfVar1 = in_stack_ffffffffffffff34;
LAB_0035fd39:
  createCoordinateSystem
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Matrix3f::Matrix3f((Matrix3f *)CONCAT44(fVar3,in_stack_ffffffffffffff50),
                     (Vector3f *)CONCAT44(in_stack_ffffffffffffff4c,fVar2),
                     (Vector3f *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (Vector3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     SUB41((uint)in_stack_ffffffffffffff34 >> 0x18,0));
  Matrix3f::inverse((Matrix3f *)CONCAT44(fVar5,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff9c);
  Matrix3f::operator=((Matrix3f *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28);
  return;
}

Assistant:

void prepare_coords() {
		if (has_uv) return;
		Vector3f v1, v2;
		o = Vector3f::ZERO;
		Vector3f norm = Vector3f::cross(v[0] - v[1], v[0] - v[2]).normalized();
		float C = Vector3f::dot(v[0], norm);
		if (fabs(norm[0]) > fabs(norm[1]) && fabs(norm[0])>fabs(norm[2])) o[0] = C / norm[0];
		else if (fabs(norm[1]) > fabs(norm[0])&&fabs(norm[1])>fabs(norm[2])) o[1] = C / norm[1];
		else o[2] = C / norm[2];
		createCoordinateSystem(norm, v1, v2);
		//norm,v1,v2 factorization
		matrix = Matrix3f(norm, v1, v2).inverse();
		/*
		cerr << norm[0] << "," << norm[1] << "," << norm[2] << " ";
		cerr << v1[0] << "," << v1[1] << "," << v1[2] << " ";
		cerr << v2[0] << "," << v2[1] << "," << v2[2] << " ";
		cerr << o[0] << " " << o[1] << " " << o[2] << "\n";*/
	}